

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserInputPtr xmlNewInputFromFd(char *url,int fd,int flags)

{
  int iVar1;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr pxVar2;
  
  if (-1 < fd) {
    buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf != (xmlParserInputBufferPtr)0x0) {
      iVar1 = xmlInputFromFd(buf,fd,flags);
      if (-1 < iVar1) {
        pxVar2 = xmlNewInputInternal(buf,url);
        return pxVar2;
      }
      xmlFreeParserInputBuffer(buf);
    }
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromFd(const char *url, int fd, int flags) {
    xmlParserInputBufferPtr buf;

    if (fd < 0)
	return(NULL);

    buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf == NULL)
        return(NULL);

    if (xmlInputFromFd(buf, fd, flags) < 0) {
        xmlFreeParserInputBuffer(buf);
        return(NULL);
    }

    return(xmlNewInputInternal(buf, url));
}